

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O1

c_int osqp_update_P_A(OSQPWorkspace *work,c_float *Px_new,c_int *Px_new_idx,c_int P_new_n,
                     c_float *Ax_new,c_int *Ax_new_idx,c_int A_new_n)

{
  csc *pcVar1;
  csc *pcVar2;
  ulong uVar3;
  c_float *pcVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  c_int cVar8;
  c_float cVar9;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar8 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_P_A");
    return cVar8;
  }
  if (work->clear_update_time == 1) {
    work->clear_update_time = 0;
    work->info->update_time = 0.0;
  }
  osqp_tic(work->timer);
  pcVar1 = work->data->P;
  pcVar2 = work->data->A;
  uVar7 = pcVar1->p[pcVar1->n];
  uVar3 = pcVar2->p[pcVar2->n];
  if ((Px_new_idx == (c_int *)0x0) || (P_new_n <= (long)uVar7)) {
    if ((Ax_new_idx == (c_int *)0x0) || (A_new_n <= (long)uVar3)) {
      if (work->settings->scaling != 0) {
        unscale_data(work);
      }
      if (Px_new_idx == (c_int *)0x0) {
        if (0 < (long)uVar7) {
          pcVar4 = work->data->P->x;
          uVar6 = 0;
          do {
            pcVar4[uVar6] = Px_new[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
        }
      }
      else if (0 < P_new_n) {
        pcVar4 = work->data->P->x;
        lVar5 = 0;
        do {
          pcVar4[Px_new_idx[lVar5]] = Px_new[lVar5];
          lVar5 = lVar5 + 1;
        } while (P_new_n != lVar5);
      }
      if (Ax_new_idx == (c_int *)0x0) {
        if (0 < (long)uVar3) {
          pcVar4 = work->data->A->x;
          uVar7 = 0;
          do {
            pcVar4[uVar7] = Ax_new[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar3 != uVar7);
        }
      }
      else if (0 < A_new_n) {
        pcVar4 = work->data->A->x;
        lVar5 = 0;
        do {
          pcVar4[Ax_new_idx[lVar5]] = Ax_new[lVar5];
          lVar5 = lVar5 + 1;
        } while (A_new_n != lVar5);
      }
      if (work->settings->scaling != 0) {
        scale_data(work);
      }
      cVar8 = (*work->linsys_solver->update_matrices)
                        (work->linsys_solver,work->data->P,work->data->A);
      reset_info(work->info);
      if (cVar8 < 0) {
        printf("ERROR in %s: ","osqp_update_P_A");
        printf("new KKT matrix is not quasidefinite");
        putchar(10);
      }
      cVar9 = osqp_toc(work->timer);
      work->info->update_time = cVar9 + work->info->update_time;
    }
    else {
      printf("ERROR in %s: ","osqp_update_P_A");
      printf("new number of elements (%i) greater than elements in A (%i)",A_new_n,
             uVar3 & 0xffffffff);
      putchar(10);
      cVar8 = 2;
    }
  }
  else {
    printf("ERROR in %s: ","osqp_update_P_A");
    printf("new number of elements (%i) greater than elements in P (%i)",P_new_n & 0xffffffff,
           uVar7 & 0xffffffff);
    putchar(10);
    cVar8 = 1;
  }
  return cVar8;
}

Assistant:

c_int osqp_update_P_A(OSQPWorkspace *work,
                      const c_float *Px_new,
                      const c_int   *Px_new_idx,
                      c_int          P_new_n,
                      const c_float *Ax_new,
                      const c_int   *Ax_new_idx,
                      c_int          A_new_n) {
  c_int i;          // For indexing
  c_int exitflag;   // Exit flag
  c_int nnzP, nnzA; // Number of nonzeros in P and A

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

#ifdef PROFILING
  if (work->clear_update_time == 1) {
    work->clear_update_time = 0;
    work->info->update_time = 0.0;
  }
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */

  nnzP = work->data->P->p[work->data->P->n];
  nnzA = work->data->A->p[work->data->A->n];


  if (Px_new_idx) { // Passing the index of elements changed
    // Check if number of elements is less or equal than the total number of
    // nonzeros in P
    if (P_new_n > nnzP) {
# ifdef PRINTING
      c_eprint("new number of elements (%i) greater than elements in P (%i)",
               (int)P_new_n,
               (int)nnzP);
# endif /* ifdef PRINTING */
      return 1;
    }
  }


  if (Ax_new_idx) { // Passing the index of elements changed
    // Check if number of elements is less or equal than the total number of
    // nonzeros in A
    if (A_new_n > nnzA) {
# ifdef PRINTING
      c_eprint("new number of elements (%i) greater than elements in A (%i)",
               (int)A_new_n,
               (int)nnzA);
# endif /* ifdef PRINTING */
      return 2;
    }
  }

  if (work->settings->scaling) {
    // Unscale data
    unscale_data(work);
  }

  // Update P elements
  if (Px_new_idx) { // Change only Px_new_idx
    for (i = 0; i < P_new_n; i++) {
      work->data->P->x[Px_new_idx[i]] = Px_new[i];
    }
  }
  else // Change whole P
  {
    for (i = 0; i < nnzP; i++) {
      work->data->P->x[i] = Px_new[i];
    }
  }

  // Update A elements
  if (Ax_new_idx) { // Change only Ax_new_idx
    for (i = 0; i < A_new_n; i++) {
      work->data->A->x[Ax_new_idx[i]] = Ax_new[i];
    }
  }
  else { // Change whole A
    for (i = 0; i < nnzA; i++) {
      work->data->A->x[i] = Ax_new[i];
    }
  }

  if (work->settings->scaling) {
    // Scale data
    scale_data(work);
  }

  // Update linear system structure with new data
  exitflag = work->linsys_solver->update_matrices(work->linsys_solver,
                                                  work->data->P,
                                                  work->data->A);

  // Reset solver information
  reset_info(work->info);

# ifdef PRINTING

  if (exitflag < 0) {
    c_eprint("new KKT matrix is not quasidefinite");
  }
# endif /* ifdef PRINTING */

#ifdef PROFILING
  work->info->update_time += osqp_toc(work->timer);
#endif /* ifdef PROFILING */

  return exitflag;
}